

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.h
# Opt level: O3

uint64_t sip24_final(siphash *H)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = *(int *)&H->p - (int)H->buf;
  uVar2 = (ulong)(uint)((int)H->c + iVar1) << 0x38;
  switch((char)iVar1) {
  case '\a':
    uVar2 = uVar2 | (ulong)H->buf[6] << 0x30;
  case '\x06':
    uVar2 = uVar2 | (ulong)H->buf[5] << 0x28;
  case '\x05':
    uVar2 = uVar2 | (ulong)H->buf[4] << 0x20;
  case '\x04':
    uVar2 = uVar2 | (ulong)H->buf[3] << 0x18;
  case '\x03':
    uVar2 = uVar2 | (ulong)H->buf[2] << 0x10;
  case '\x02':
    uVar2 = uVar2 | (ulong)H->buf[1] << 8;
  case '\x01':
    uVar2 = uVar2 | H->buf[0];
  default:
    H->v3 = H->v3 ^ uVar2;
    sip_round(H,2);
    H->v0 = H->v0 ^ uVar2;
    *(byte *)&H->v2 = ~(byte)H->v2;
    sip_round(H,4);
    return H->v3 ^ H->v1 ^ H->v2 ^ H->v0;
  }
}

Assistant:

static uint64_t sip24_final(struct siphash *H) {
	const char left = (char)(H->p - H->buf);
	uint64_t b = (H->c + left) << 56;

	switch (left) {
	case 7: b |= (uint64_t)H->buf[6] << 48;
	case 6: b |= (uint64_t)H->buf[5] << 40;
	case 5: b |= (uint64_t)H->buf[4] << 32;
	case 4: b |= (uint64_t)H->buf[3] << 24;
	case 3: b |= (uint64_t)H->buf[2] << 16;
	case 2: b |= (uint64_t)H->buf[1] << 8;
	case 1: b |= (uint64_t)H->buf[0] << 0;
	case 0: break;
	}

	H->v3 ^= b;
	sip_round(H, 2);
	H->v0 ^= b;
	H->v2 ^= 0xff;
	sip_round(H, 4);

	return H->v0 ^ H->v1 ^ H->v2  ^ H->v3;
}